

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall cmCacheManager::RemoveCacheEntry(cmCacheManager *this,string *key)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  iterator i;
  string *key_local;
  cmCacheManager *this_local;
  
  i._M_node = (_Base_ptr)key;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
       ::find(&this->Cache,key);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
       ::end(&this->Cache);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    std::
    map<std::__cxx11::string,cmCacheManager::CacheEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCacheManager::CacheEntry>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,cmCacheManager::CacheEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCacheManager::CacheEntry>>>
                        *)&this->Cache,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void cmCacheManager::RemoveCacheEntry(const std::string& key)
{
  CacheEntryMap::iterator i = this->Cache.find(key);
  if (i != this->Cache.end()) {
    this->Cache.erase(i);
  }
}